

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

int Lf_ObjArrival_rec(Lf_Man_t *p,Gia_Obj_t *pDriver)

{
  int iVar1;
  Gia_Obj_t *pDriver_00;
  Lf_Bst_t *pLVar2;
  Gia_Obj_t *pDriver_local;
  Lf_Man_t *p_local;
  
  iVar1 = Gia_ObjIsBuf(pDriver);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsAnd(pDriver);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCi(pDriver);
      if (iVar1 == 0) {
        p_local._4_4_ = 0;
      }
      else {
        iVar1 = Gia_ObjCioId(pDriver);
        p_local._4_4_ = Lf_ObjCiArrival(p,iVar1);
      }
    }
    else {
      iVar1 = Gia_ObjId(p->pGia,pDriver);
      pLVar2 = Lf_ObjReadBest(p,iVar1);
      p_local._4_4_ = pLVar2->Delay[0];
    }
  }
  else {
    pDriver_00 = Gia_ObjFanin0(pDriver);
    p_local._4_4_ = Lf_ObjArrival_rec(p,pDriver_00);
  }
  return p_local._4_4_;
}

Assistant:

int Lf_ObjArrival_rec( Lf_Man_t * p, Gia_Obj_t * pDriver )
{
    if ( Gia_ObjIsBuf(pDriver) )
        return Lf_ObjArrival_rec( p, Gia_ObjFanin0(pDriver) );
    if ( Gia_ObjIsAnd(pDriver) )
        return Lf_ObjReadBest(p, Gia_ObjId(p->pGia, pDriver))->Delay[0];
    if ( Gia_ObjIsCi(pDriver) )
        return Lf_ObjCiArrival(p, Gia_ObjCioId(pDriver));
    return 0;
}